

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

void __thiscall
libmatroska::KaxBlockVirtual::KaxBlockVirtual(KaxBlockVirtual *this,KaxBlockVirtual *ElementToClone)

{
  KaxBlockVirtual *ElementToClone_local;
  KaxBlockVirtual *this_local;
  
  libebml::EbmlBinary::EbmlBinary(&this->super_EbmlBinary,&ElementToClone->super_EbmlBinary);
  (this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement =
       (_func_int **)&PTR__KaxBlockVirtual_00237540;
  this->Timecode = ElementToClone->Timecode;
  this->TrackNumber = ElementToClone->TrackNumber;
  this->ParentCluster = ElementToClone->ParentCluster;
  libebml::EbmlBinary::SetBuffer(&this->super_EbmlBinary,this->DataBlock,5);
  libebml::EbmlElement::SetValueIsSet((EbmlElement *)this,false);
  return;
}

Assistant:

KaxBlockVirtual::KaxBlockVirtual(const KaxBlockVirtual & ElementToClone)
  :EbmlBinary(ElementToClone)
  ,Timecode(ElementToClone.Timecode)
  ,TrackNumber(ElementToClone.TrackNumber)
  ,ParentCluster(ElementToClone.ParentCluster) ///< \todo not exactly
{
  SetBuffer(DataBlock,sizeof(DataBlock));
  SetValueIsSet(false);
}